

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O3

void __thiscall
density::
lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
::~lf_heter_queue(lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                  *this)

{
  ControlBlock *pCVar1;
  Consume consume;
  Consume local_28;
  
  clear(this);
  local_28.m_queue =
       (LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
        *)0x0;
  local_28.m_control = (ControlBlock *)0x0;
  local_28.m_next_ptr = 0;
  pCVar1 = (this->
           super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
           ).m_head;
  if (pCVar1 == (ControlBlock *)0x0) {
    pCVar1 = (this->
             super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
             ).
             super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
             .m_initial_page._M_b._M_p;
    (this->
    super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
    ).m_head = pCVar1;
    if (pCVar1 == (ControlBlock *)0x0) goto LAB_00ac74da;
  }
  local_28.m_next_ptr = pCVar1->m_next;
  local_28.m_queue =
       &this->
        super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
  ;
  local_28.m_control = pCVar1;
  if (0xf < local_28.m_next_ptr) {
    detail::
    LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
    ::Consume::clean_dead_elements(&local_28);
  }
LAB_00ac74da:
  detail::
  LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::~LFQueue_Tail((LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                   *)this);
  return;
}

Assistant:

~lf_heter_queue()
        {
            clear();

            Consume consume;
            consume.begin_iteration(this);
            if (!consume.empty())
            {
                consume.clean_dead_elements();
            }
        }